

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O0

DecimalFormatSymbols * __thiscall
icu_63::DecimalFormatSymbols::operator=(DecimalFormatSymbols *this,DecimalFormatSymbols *rhs)

{
  int local_20;
  uint local_1c;
  int32_t i_1;
  int32_t i;
  DecimalFormatSymbols *rhs_local;
  DecimalFormatSymbols *this_local;
  
  if (this != rhs) {
    for (local_1c = 0; (int)local_1c < 0x1c; local_1c = local_1c + 1) {
      UnicodeString::fastCopyFrom
                ((UnicodeString *)(&this->field_0x8 + (ulong)local_1c * 0x40),
                 (UnicodeString *)(&rhs->field_0x8 + (ulong)local_1c * 0x40));
    }
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      UnicodeString::fastCopyFrom
                ((UnicodeString *)(&this->field_0x978 + (long)local_20 * 0x40),
                 (UnicodeString *)(&rhs->field_0x978 + (long)local_20 * 0x40));
      UnicodeString::fastCopyFrom
                ((UnicodeString *)(&this->field_0xa38 + (long)local_20 * 0x40),
                 (UnicodeString *)(&rhs->field_0xa38 + (long)local_20 * 0x40));
    }
    Locale::operator=(&this->locale,&rhs->locale);
    strcpy(this->validLocale,rhs->validLocale);
    strcpy(this->actualLocale,rhs->actualLocale);
    this->fIsCustomCurrencySymbol = rhs->fIsCustomCurrencySymbol;
    this->fIsCustomIntlCurrencySymbol = rhs->fIsCustomIntlCurrencySymbol;
    this->fCodePointZero = rhs->fCodePointZero;
  }
  return this;
}

Assistant:

DecimalFormatSymbols&
DecimalFormatSymbols::operator=(const DecimalFormatSymbols& rhs)
{
    if (this != &rhs) {
        for(int32_t i = 0; i < (int32_t)kFormatSymbolCount; ++i) {
            // fastCopyFrom is safe, see docs on fSymbols
            fSymbols[(ENumberFormatSymbol)i].fastCopyFrom(rhs.fSymbols[(ENumberFormatSymbol)i]);
        }
        for(int32_t i = 0; i < (int32_t)UNUM_CURRENCY_SPACING_COUNT; ++i) {
            currencySpcBeforeSym[i].fastCopyFrom(rhs.currencySpcBeforeSym[i]);
            currencySpcAfterSym[i].fastCopyFrom(rhs.currencySpcAfterSym[i]);
        }
        locale = rhs.locale;
        uprv_strcpy(validLocale, rhs.validLocale);
        uprv_strcpy(actualLocale, rhs.actualLocale);
        fIsCustomCurrencySymbol = rhs.fIsCustomCurrencySymbol; 
        fIsCustomIntlCurrencySymbol = rhs.fIsCustomIntlCurrencySymbol; 
        fCodePointZero = rhs.fCodePointZero;
    }
    return *this;
}